

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "const ::$proto_ns$::Message::ClassData $classname$::_class_data_ = {\n    $superclass$::CopyImpl,\n    $superclass$::MergeImpl,\n};\nconst ::$proto_ns$::Message::ClassData*$classname$::GetClassData() const { return &_class_data_; }\n\n\n"
              );
  }
  else {
    file = Descriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(file,&this->options_);
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "const ::$proto_ns$::Message::ClassData $classname$::_class_data_ = {\n    ::$proto_ns$::Message::CopyWithSizeCheck,\n    $classname$::MergeImpl\n};\nconst ::$proto_ns$::Message::ClassData*$classname$::GetClassData() const { return &_class_data_; }\n\nvoid $classname$::MergeImpl(::$proto_ns$::Message* to,\n                      const ::$proto_ns$::Message& from) {\n  static_cast<$classname$ *>(to)->MergeFrom(\n      static_cast<const $classname$ &>(from));\n}\n\n"
                );
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "void $classname$::CheckTypeAndMergeFrom(\n    const ::$proto_ns$::MessageLite& from) {\n  MergeFrom(*::$proto_ns$::internal::DownCast<const $classname$*>(\n      &from));\n}\n"
                );
    }
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageGenerator::GenerateMergeFrom(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!HasSimpleBaseClass(descriptor_, options_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      // We don't override the generalized MergeFrom (aka that which
      // takes in the Message base class as a parameter); instead we just
      // let the base Message::MergeFrom take care of it.  The base MergeFrom
      // knows how to quickly confirm the types exactly match, and if so, will
      // use GetClassData() to retrieve the address of MergeImpl, which calls
      // the fast MergeFrom overload.  Most callers avoid all this by passing
      // a "from" message that is the same type as the message being merged
      // into, rather than a generic Message.

      format(
          "const ::$proto_ns$::Message::ClassData "
          "$classname$::_class_data_ = {\n"
          "    ::$proto_ns$::Message::CopyWithSizeCheck,\n"
          "    $classname$::MergeImpl\n"
          "};\n"
          "const ::$proto_ns$::Message::ClassData*"
          "$classname$::GetClassData() const { return &_class_data_; }\n"
          "\n"
          "void $classname$::MergeImpl(::$proto_ns$::Message* to,\n"
          "                      const ::$proto_ns$::Message& from) {\n"
          "  static_cast<$classname$ *>(to)->MergeFrom(\n"
          "      static_cast<const $classname$ &>(from));\n"
          "}\n"
          "\n");
    } else {
      // Generate CheckTypeAndMergeFrom().
      format(
          "void $classname$::CheckTypeAndMergeFrom(\n"
          "    const ::$proto_ns$::MessageLite& from) {\n"
          "  MergeFrom(*::$proto_ns$::internal::DownCast<const $classname$*>(\n"
          "      &from));\n"
          "}\n");
    }
  } else {
    // In the simple case, we just define ClassData that vectors back to the
    // simple implementation of Copy and Merge.
    format(
        "const ::$proto_ns$::Message::ClassData "
        "$classname$::_class_data_ = {\n"
        "    $superclass$::CopyImpl,\n"
        "    $superclass$::MergeImpl,\n"
        "};\n"
        "const ::$proto_ns$::Message::ClassData*"
        "$classname$::GetClassData() const { return &_class_data_; }\n"
        "\n"
        "\n");
  }
}